

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::metrics::MetricsTest_testGauge_Test::~MetricsTest_testGauge_Test
          (MetricsTest_testGauge_Test *this)

{
  MetricsTest_testGauge_Test *this_local;
  
  ~MetricsTest_testGauge_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MetricsTest, testGauge)
{
    constexpr auto gaugeValue = static_cast<int64_t>(3);
    constexpr auto metricName = "jaeger.test-gauge";
    StatsFactoryImpl factory(_metricsReporter);
    auto gauge = factory.createGauge(metricName);
    gauge->update(gaugeValue);
    const auto& gauges = _metricsReporter.gauges();
    ASSERT_EQ(1, gauges.size());
    auto itr = gauges.find(metricName);
    ASSERT_TRUE(itr != std::end(gauges));
    ASSERT_EQ(gaugeValue, itr->second);
}